

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderErrorCode
ReadHuffmanCode(uint32_t alphabet_size,HuffmanCode *table,uint32_t *opt_table_size,
               BrotliDecoderStateInternal *s)

{
  BrotliRunningState BVar1;
  bool bVar2;
  BrotliDecoderErrorCode local_19c;
  BrotliDecoderErrorCode result_2;
  uint32_t table_size_1;
  BrotliDecoderErrorCode result_1;
  uint32_t i;
  uint32_t bits;
  uint32_t table_size;
  BrotliDecoderErrorCode result;
  BrotliBitReader *br;
  BrotliDecoderStateInternal *s_local;
  uint32_t *opt_table_size_local;
  HuffmanCode *table_local;
  uint32_t alphabet_size_local;
  undefined4 local_14c;
  BrotliBitReader *local_148;
  int local_13c;
  uint32_t *local_138;
  undefined4 local_12c;
  BrotliBitReader *local_128;
  int local_11c;
  uint32_t *local_118;
  undefined4 local_10c;
  BrotliBitReader *local_108;
  int local_fc;
  BrotliBitReader *local_f8;
  BrotliBitReader *local_f0;
  BrotliBitReader *local_e8;
  uint32_t *local_e0;
  undefined4 local_d4;
  BrotliBitReader *local_d0;
  undefined4 local_c8;
  uint32_t local_c4;
  uint32_t *local_c0;
  undefined4 local_b4;
  BrotliBitReader *local_b0;
  undefined4 local_a8;
  uint32_t local_a4;
  BrotliDecoderErrorCode *local_a0;
  undefined4 local_94;
  BrotliBitReader *local_90;
  undefined4 local_88;
  uint32_t local_84;
  BrotliBitReader *local_80;
  BrotliBitReader *local_78;
  BrotliBitReader *local_70;
  undefined4 local_64;
  BrotliBitReader *local_60;
  undefined4 local_54;
  BrotliBitReader *local_50;
  undefined4 local_44;
  BrotliBitReader *local_40;
  BrotliBitReader *local_38;
  uint local_2c;
  BrotliBitReader *local_28;
  uint local_1c;
  BrotliBitReader *local_18;
  uint local_c;
  
  _table_size = &s->br;
  table_local._0_4_ = alphabet_size & 0x3ff;
  br = (BrotliBitReader *)s;
  s_local = (BrotliDecoderStateInternal *)opt_table_size;
  opt_table_size_local = (uint32_t *)table;
  switch(s->substate_huffman) {
  case BROTLI_STATE_HUFFMAN_NONE:
    local_118 = &s->sub_loop_counter;
    local_10c = 2;
    do {
      if (1 < 0x40 - (s->br).bit_pos_) {
        local_d4 = 2;
        local_c8 = 2;
        local_c4 = 3;
        *local_118 = (uint)(_table_size->val_ >> ((byte)(s->br).bit_pos_ & 0x3f)) & 3;
        local_44 = 2;
        (s->br).bit_pos_ = (s->br).bit_pos_ + 2;
        local_fc = 1;
        local_e0 = local_118;
        local_d0 = _table_size;
        local_70 = _table_size;
        local_40 = _table_size;
        goto LAB_001058b5;
      }
      bVar2 = (s->br).avail_in != 0;
      if (bVar2) {
        _table_size->val_ = _table_size->val_ >> 8;
        _table_size->val_ = (ulong)*(s->br).next_in << 0x38 | _table_size->val_;
        (s->br).bit_pos_ = (s->br).bit_pos_ - 8;
        (s->br).avail_in = (s->br).avail_in - 1;
        (s->br).next_in = (s->br).next_in + 1;
      }
      local_2c = (uint)bVar2;
      local_38 = _table_size;
    } while (local_2c != 0);
    local_fc = 0;
LAB_001058b5:
    if (local_fc == 0) {
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    local_108 = _table_size;
    local_f8 = _table_size;
    if (s->sub_loop_counter == 1) goto switchD_0010571c_caseD_1;
    s->space = 0x20;
    s->repeat = 0;
    memset(s->code_length_histo,0,0xc);
    memset(&br[0x42].next_in,0,0x12);
    *(undefined4 *)((long)&br[0x9e].avail_in + 4) = 4;
  case BROTLI_STATE_HUFFMAN_COMPLEX:
    table_local._4_4_ = ReadCodeLengthCodeLengths((BrotliDecoderStateInternal *)br);
    if (table_local._4_4_ == BROTLI_DECODER_SUCCESS) {
      BrotliBuildCodeLengthsHuffmanTable
                ((HuffmanCode *)((long)&br[0xd].val_ + 4),(uint8_t *)&br[0x42].next_in,
                 (uint16_t *)((long)&br[0x43].val_ + 2));
      memset((void *)((long)&br[0x43].val_ + 2),0,0x20);
      for (table_size_1 = 0; table_size_1 < 0x10; table_size_1 = table_size_1 + 1) {
        *(uint32_t *)((long)&br[0x3e].next_in + (ulong)table_size_1 * 4) = table_size_1 - 0x10;
        *(undefined2 *)(*(long *)&br[0x11].bit_pos_ + (long)(int)(table_size_1 - 0x10) * 2) = 0xffff
        ;
      }
      *(undefined4 *)&br[0xc].avail_in = 0;
      *(undefined4 *)&br[0xb].avail_in = 8;
      *(undefined4 *)((long)&br[0xc].avail_in + 4) = 0;
      *(undefined4 *)((long)&br[0xb].next_in + 4) = 0;
      *(undefined4 *)&br[0xd].val_ = 0x8000;
      *(undefined4 *)((long)&br[0x9e].avail_in + 4) = 5;
switchD_0010571c_caseD_5:
      local_19c = ReadSymbolCodeLengths((uint)table_local,(BrotliDecoderStateInternal *)br);
      if (local_19c == BROTLI_DECODER_NEEDS_MORE_INPUT) {
        local_19c = SafeReadSymbolCodeLengths((uint)table_local,(BrotliDecoderStateInternal *)br);
      }
      if (local_19c == BROTLI_DECODER_SUCCESS) {
        if ((int)br[0xd].val_ == 0) {
          BVar1 = BrotliBuildHuffmanTable
                            ((HuffmanCode *)opt_table_size_local,8,*(uint16_t **)&br[0x11].bit_pos_,
                             (uint16_t *)((long)&br[0x43].val_ + 2));
          if (s_local != (BrotliDecoderStateInternal *)0x0) {
            s_local->state = BVar1;
          }
          *(undefined4 *)((long)&br[0x9e].avail_in + 4) = 0;
          table_local._4_4_ = BROTLI_DECODER_SUCCESS;
        }
        else {
          table_local._4_4_ = BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
        }
      }
      else {
        table_local._4_4_ = local_19c;
      }
    }
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
switchD_0010571c_caseD_1:
    local_138 = &s->symbol;
    local_12c = 2;
    do {
      if (1 < 0x40 - (s->br).bit_pos_) {
        local_b4 = 2;
        local_a8 = 2;
        local_a4 = 3;
        *local_138 = (uint)(_table_size->val_ >> ((byte)(s->br).bit_pos_ & 0x3f)) & 3;
        local_54 = 2;
        (s->br).bit_pos_ = (s->br).bit_pos_ + 2;
        local_11c = 1;
        local_c0 = local_138;
        local_b0 = _table_size;
        local_78 = _table_size;
        local_50 = _table_size;
        goto LAB_00105ae1;
      }
      bVar2 = (s->br).avail_in != 0;
      if (bVar2) {
        _table_size->val_ = _table_size->val_ >> 8;
        _table_size->val_ = (ulong)*(s->br).next_in << 0x38 | _table_size->val_;
        (s->br).bit_pos_ = (s->br).bit_pos_ - 8;
        (s->br).avail_in = (s->br).avail_in - 1;
        (s->br).next_in = (s->br).next_in + 1;
      }
      local_1c = (uint)bVar2;
      local_28 = _table_size;
    } while (local_1c != 0);
    local_11c = 0;
LAB_00105ae1:
    if (local_11c == 0) {
      s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    s->sub_loop_counter = 0;
    local_128 = _table_size;
    local_f0 = _table_size;
  case BROTLI_STATE_HUFFMAN_SIMPLE_READ:
    table_local._4_4_ = ReadSimpleHuffmanSymbols((uint)table_local,s);
    if (table_local._4_4_ == BROTLI_DECODER_SUCCESS) {
      bits = 1;
switchD_0010571c_caseD_3:
      if ((int)br[0xc].avail_in == 3) {
        local_148 = _table_size;
        local_14c = 1;
        _alphabet_size_local = &result_1;
        do {
          local_e8 = _table_size;
          if (_table_size->bit_pos_ != 0x40) {
            local_90 = _table_size;
            local_94 = 1;
            local_80 = _table_size;
            local_88 = 1;
            local_84 = 1;
            result_1 = (BrotliDecoderErrorCode)
                       (_table_size->val_ >> ((byte)_table_size->bit_pos_ & 0x3f)) & 1;
            local_60 = _table_size;
            local_64 = 1;
            _table_size->bit_pos_ = _table_size->bit_pos_ + 1;
            local_13c = 1;
            local_a0 = _alphabet_size_local;
            goto LAB_00105ce7;
          }
          local_18 = _table_size;
          bVar2 = _table_size->avail_in != 0;
          if (bVar2) {
            _table_size->val_ = _table_size->val_ >> 8;
            _table_size->val_ = (ulong)*_table_size->next_in << 0x38 | _table_size->val_;
            _table_size->bit_pos_ = _table_size->bit_pos_ - 8;
            _table_size->avail_in = _table_size->avail_in - 1;
            _table_size->next_in = _table_size->next_in + 1;
          }
          local_c = (uint)bVar2;
        } while (local_c != 0);
        local_13c = 0;
LAB_00105ce7:
        if (local_13c == 0) {
          *(undefined4 *)((long)&br[0x9e].avail_in + 4) = 3;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        *(BrotliDecoderErrorCode *)&br[0xc].avail_in = result_1 + (int)br[0xc].avail_in;
      }
      BVar1 = BrotliBuildSimpleHuffmanTable
                        ((HuffmanCode *)opt_table_size_local,8,(uint16_t *)&br[0x11].next_in,
                         (uint32_t)br[0xc].avail_in);
      if (s_local != (BrotliDecoderStateInternal *)0x0) {
        s_local->state = BVar1;
      }
      *(undefined4 *)((long)&br[0x9e].avail_in + 4) = 0;
      table_local._4_4_ = BROTLI_DECODER_SUCCESS;
    }
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD:
    goto switchD_0010571c_caseD_3;
  case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS:
    goto switchD_0010571c_caseD_5;
  default:
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  return table_local._4_4_;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(uint32_t alphabet_size,
                                              HuffmanCode* table,
                                              uint32_t* opt_table_size,
                                              BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  /* Unnecessary masking, but might be good for safety. */
  alphabet_size &= 0x3ff;
  /* State machine */
  switch (s->substate_huffman) {
    case BROTLI_STATE_HUFFMAN_NONE:
      if (!BrotliSafeReadBits(br, 2, &s->sub_loop_counter)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      BROTLI_LOG_UINT(s->sub_loop_counter);
      /* The value is used as follows:
         1 for simple code;
         0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
      if (s->sub_loop_counter != 1) {
        s->space = 32;
        s->repeat = 0; /* num_codes */
        memset(&s->code_length_histo[0], 0, sizeof(s->code_length_histo[0]) *
            (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
        memset(&s->code_length_code_lengths[0], 0,
            sizeof(s->code_length_code_lengths));
        s->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
        goto Complex;
      }
      /* No break, transit to the next state. */

    case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
      /* Read symbols, codes & code lengths directly. */
      if (!BrotliSafeReadBits(br, 2, &s->symbol)) { /* num_symbols */
        s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      s->sub_loop_counter = 0;
      /* No break, transit to the next state. */
    case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
      BrotliDecoderErrorCode result =
          ReadSimpleHuffmanSymbols(alphabet_size, s);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      /* No break, transit to the next state. */
    }
    case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
      uint32_t table_size;
      if (s->symbol == 3) {
        uint32_t bits;
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->symbol += bits;
      }
      BROTLI_LOG_UINT(s->symbol);
      table_size = BrotliBuildSimpleHuffmanTable(
          table, HUFFMAN_TABLE_BITS, s->symbols_lists_array, s->symbol);
      if (opt_table_size) {
        *opt_table_size = table_size;
      }
      s->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

Complex: /* Decode Huffman-coded code lengths. */
    case BROTLI_STATE_HUFFMAN_COMPLEX: {
      uint32_t i;
      BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      BrotliBuildCodeLengthsHuffmanTable(s->table,
                                         s->code_length_code_lengths,
                                         s->code_length_histo);
      memset(&s->code_length_histo[0], 0, sizeof(s->code_length_histo));
      for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
        s->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
        s->symbol_lists[(int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1)] = 0xFFFF;
      }

      s->symbol = 0;
      s->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
      s->repeat = 0;
      s->repeat_code_len = 0;
      s->space = 32768;
      s->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
      /* No break, transit to the next state. */
    }
    case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
      uint32_t table_size;
      BrotliDecoderErrorCode result = ReadSymbolCodeLengths(alphabet_size, s);
      if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
        result = SafeReadSymbolCodeLengths(alphabet_size, s);
      }
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }

      if (s->space != 0) {
        BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", s->space));
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
      }
      table_size = BrotliBuildHuffmanTable(
          table, HUFFMAN_TABLE_BITS, s->symbol_lists, s->code_length_histo);
      if (opt_table_size) {
        *opt_table_size = table_size;
      }
      s->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}